

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psi.cpp
# Opt level: O2

int __thiscall pg::PSISolver::mark_solved_seq(PSISolver *this)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  
  lVar3 = done;
  lVar2 = won;
  uVar1 = ((this->super_Solver).game)->n_vertices;
  iVar4 = 0;
  for (uVar5 = 0; (~((long)uVar1 >> 0x3f) & uVar1) != uVar5; uVar5 = uVar5 + 1) {
    if (*(int *)(lVar3 + uVar5 * 4) == 2) {
      iVar4 = iVar4 + 1;
      *(undefined4 *)(lVar2 + uVar5 * 4) = 1;
      *(undefined4 *)(lVar3 + uVar5 * 4) = 3;
    }
  }
  return iVar4;
}

Assistant:

int
PSISolver::mark_solved_seq(void)
{
    int res = 0;
    for (int n=0; n<nodecount(); n++) {
        if (done[n] == 2) { // done[n] == 3 proxies disabled and won
            won[n] = 1;
            done[n] = 3; // mark as won
            res++;
        }
    }
    return res;
}